

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O0

void __thiscall
Enhedron::CommandLine::Impl::Impl_Parameters::Name::Name
          (Name *this,char shortName,string *longName,string *description)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  allocator local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *description_local;
  string *longName_local;
  Name *pNStack_10;
  char shortName_local;
  Name *this_local;
  
  local_28 = description;
  description_local = longName;
  longName_local._7_1_ = shortName;
  pNStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"-",&local_49);
  Util::Impl::Impl_Optional::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->shortName_,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::operator+(&this->longName_,"--",longName);
  Util::Impl::Impl_Optional::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&this->description_,description);
  pbVar1 = Util::Impl::Impl_Optional::
           optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator->(&this->shortName_);
  std::__cxx11::string::push_back((char)pbVar1);
  return;
}

Assistant:

Name(char shortName, string longName, string description) :
                shortName_("-"), longName_("--" + longName), description_(move(description))
        {
            shortName_->push_back(shortName);
        }